

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O2

EStatusCode __thiscall
ShadingWriter::WriteLinearShadingPatternObject
          (ShadingWriter *this,double inX0,double inY0,double inX1,double inY1,
          InterpretedGradientStopList *inColorLine,FT_PaintExtend inGradientExtend,
          PDFRectangle *inBounds,PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  InterpretedGradientStopList *this_00;
  bool bVar1;
  EStatusCode EVar2;
  ShadingWriter *this_01;
  LinearShading linearParams;
  LinearShading local_70;
  
  this_00 = &local_70.colorLine;
  this_01 = (ShadingWriter *)this_00;
  local_70.x0 = inX0;
  local_70.y0 = inY0;
  local_70.x1 = inX1;
  local_70.y1 = inY1;
  std::__cxx11::list<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::list
            (this_00,inColorLine);
  local_70.gradientExtend = inGradientExtend;
  bVar1 = ColorLineHasTransparency(this_01,inColorLine);
  if (bVar1) {
    EVar2 = WriteRGBATiledPatternObject(this,&local_70,inBounds,inMatrix,inPatternObjectId);
  }
  else {
    EVar2 = WriteRGBShadingPatternObject(this,&local_70,inBounds,inMatrix,inPatternObjectId);
  }
  std::__cxx11::_List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>::
  _M_clear(&this_00->
            super__List_base<InterpretedGradientStop,_std::allocator<InterpretedGradientStop>_>);
  return EVar2;
}

Assistant:

EStatusCode ShadingWriter::WriteLinearShadingPatternObject(
    double inX0,
    double inY0,
    double inX1,
    double inY1,
    const InterpretedGradientStopList& inColorLine,
    FT_PaintExtend inGradientExtend,
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId
) {
    LinearShading linearParams = {
        inX0,
        inY0,
        inX1,
        inY1,
        inColorLine,
        inGradientExtend
    };

    if(ColorLineHasTransparency(inColorLine))
        return WriteRGBATiledPatternObject(linearParams, inBounds, inMatrix, inPatternObjectId);
    else
        return WriteRGBShadingPatternObject(linearParams, inBounds, inMatrix, inPatternObjectId);

}